

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_concat.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
nlohmann::json_abi_v3_11_2::detail::concat<std::__cxx11::string,char_const(&)[25],char_const*>
          (char (*args) [25],char **args_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out;
  
  out = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  concat_length<char_const*>((char *)out,(char **)in_RDI);
  std::__cxx11::string::reserve((ulong)in_RDI);
  concat_into<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[25],_const_char_*,_0>
            (out,(char (*) [25])in_RDI,(char **)0x1846e2);
  return out;
}

Assistant:

inline OutStringType concat(Args && ... args)
{
    OutStringType str;
    str.reserve(concat_length(std::forward<Args>(args)...));
    concat_into(str, std::forward<Args>(args)...);
    return str;
}